

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common_expression_delete.hpp
# Opt level: O0

void __thiscall
optimization::common_expr_del::Common_Expr_Del::init_funcs
          (Common_Expr_Del *this,MirPackage *package)

{
  bool bVar1;
  int iVar2;
  element_type *peVar3;
  pointer pIVar4;
  key_type *__x;
  size_type sVar5;
  long in_RSI;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_RDI;
  pair<std::_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>
  pVar6;
  CallInst *callInst;
  Inst *i;
  unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_> *inst;
  iterator __end4;
  iterator __begin4;
  vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
  *__range4;
  pair<const_int,_mir::inst::BasicBlk> *blkpair;
  iterator __end3;
  iterator __begin3;
  map<int,_mir::inst::BasicBlk,_std::less<int>,_std::allocator<std::pair<const_int,_mir::inst::BasicBlk>_>_>
  *__range3;
  bool flag;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mir::inst::MirFunction>
  *funcpair_1;
  iterator __end2_1;
  iterator __begin2_1;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mir::inst::MirFunction,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mir::inst::MirFunction>_>_>
  *__range2_1;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mir::inst::MirFunction>
  *funcpair;
  iterator __end2;
  iterator __begin2;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mir::inst::MirFunction,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mir::inst::MirFunction>_>_>
  *__range2;
  key_type *in_stack_ffffffffffffff28;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_ffffffffffffff30;
  value_type *in_stack_ffffffffffffff48;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_ffffffffffffff50;
  __normal_iterator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_*,_std::vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>_>
  local_98;
  vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
  *local_90;
  reference local_88;
  _Self local_80;
  _Self local_78;
  map<int,_mir::inst::BasicBlk,_std::less<int>,_std::allocator<std::pair<const_int,_mir::inst::BasicBlk>_>_>
  *local_70;
  byte local_61;
  reference local_60;
  _Self local_58;
  _Self local_50;
  long local_48;
  _Base_ptr local_40;
  undefined1 local_38;
  reference local_30;
  _Self local_28;
  _Self local_20;
  long local_18;
  long local_10;
  
  local_18 = in_RSI + 8;
  local_10 = in_RSI;
  local_20._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mir::inst::MirFunction,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mir::inst::MirFunction>_>_>
       ::begin((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mir::inst::MirFunction,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mir::inst::MirFunction>_>_>
                *)in_stack_ffffffffffffff28);
  local_28._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mir::inst::MirFunction,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mir::inst::MirFunction>_>_>
       ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mir::inst::MirFunction,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mir::inst::MirFunction>_>_>
              *)in_stack_ffffffffffffff28);
  while (bVar1 = std::operator!=(&local_20,&local_28), bVar1) {
    local_30 = std::
               _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mir::inst::MirFunction>_>
               ::operator*((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mir::inst::MirFunction>_>
                            *)0x1658ca);
    peVar3 = std::
             __shared_ptr_access<mir::types::FunctionTy,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<mir::types::FunctionTy,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x1658e7);
    if ((peVar3->is_extern & 1U) == 0) {
      pVar6 = std::
              set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::insert(in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
      local_40 = (_Base_ptr)pVar6.first._M_node;
      local_38 = pVar6.second;
    }
    std::
    _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mir::inst::MirFunction>_>
    ::operator++((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mir::inst::MirFunction>_>
                  *)in_stack_ffffffffffffff30);
  }
  local_48 = local_10 + 8;
  local_50._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mir::inst::MirFunction,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mir::inst::MirFunction>_>_>
       ::begin((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mir::inst::MirFunction,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mir::inst::MirFunction>_>_>
                *)in_stack_ffffffffffffff28);
  local_58._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mir::inst::MirFunction,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mir::inst::MirFunction>_>_>
       ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mir::inst::MirFunction,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mir::inst::MirFunction>_>_>
              *)in_stack_ffffffffffffff28);
  do {
    bVar1 = std::operator!=(&local_50,&local_58);
    if (!bVar1) {
      return;
    }
    local_60 = std::
               _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mir::inst::MirFunction>_>
               ::operator*((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mir::inst::MirFunction>_>
                            *)0x16598f);
    local_61 = 0;
    local_70 = &(local_60->second).basic_blks;
    local_78._M_node =
         (_Base_ptr)
         std::
         map<int,_mir::inst::BasicBlk,_std::less<int>,_std::allocator<std::pair<const_int,_mir::inst::BasicBlk>_>_>
         ::begin((map<int,_mir::inst::BasicBlk,_std::less<int>,_std::allocator<std::pair<const_int,_mir::inst::BasicBlk>_>_>
                  *)in_stack_ffffffffffffff28);
    local_80._M_node =
         (_Base_ptr)
         std::
         map<int,_mir::inst::BasicBlk,_std::less<int>,_std::allocator<std::pair<const_int,_mir::inst::BasicBlk>_>_>
         ::end((map<int,_mir::inst::BasicBlk,_std::less<int>,_std::allocator<std::pair<const_int,_mir::inst::BasicBlk>_>_>
                *)in_stack_ffffffffffffff28);
    while (bVar1 = std::operator!=(&local_78,&local_80), bVar1) {
      local_88 = std::_Rb_tree_iterator<std::pair<const_int,_mir::inst::BasicBlk>_>::operator*
                           ((_Rb_tree_iterator<std::pair<const_int,_mir::inst::BasicBlk>_> *)
                            0x1659eb);
      local_90 = &(local_88->second).inst;
      local_98._M_current =
           (unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_> *)
           std::
           vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
           ::begin((vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
                    *)in_stack_ffffffffffffff28);
      std::
      vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
      ::end((vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
             *)in_stack_ffffffffffffff28);
      while (bVar1 = __gnu_cxx::operator!=
                               ((__normal_iterator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_*,_std::vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>_>
                                 *)in_stack_ffffffffffffff30,
                                (__normal_iterator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_*,_std::vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>_>
                                 *)in_stack_ffffffffffffff28), bVar1) {
        __gnu_cxx::
        __normal_iterator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_*,_std::vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>_>
        ::operator*(&local_98);
        pIVar4 = std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>::operator->
                           ((unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_> *)
                            0x165a51);
        iVar2 = (*(pIVar4->super_Displayable)._vptr_Displayable[1])();
        if (iVar2 == 3) {
LAB_00165a77:
          local_61 = 1;
          break;
        }
        pIVar4 = std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>::operator->
                           ((unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_> *)
                            0x165a69);
        iVar2 = (*(pIVar4->super_Displayable)._vptr_Displayable[1])();
        if (iVar2 == 4) goto LAB_00165a77;
        pIVar4 = std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>::operator->
                           ((unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_> *)
                            0x165a8b);
        iVar2 = (*(pIVar4->super_Displayable)._vptr_Displayable[1])();
        if (iVar2 == 6) {
          __x = (key_type *)
                std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>::operator*
                          ((unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_> *)
                           in_stack_ffffffffffffff30);
          if (__x == (key_type *)0x0) {
            in_stack_ffffffffffffff30 =
                 (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)0x0;
          }
          else {
            in_stack_ffffffffffffff30 =
                 (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)__dynamic_cast(__x,&mir::inst::Inst::typeinfo,&mir::inst::CallInst::typeinfo,0);
          }
          sVar5 = std::
                  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::count(in_RDI,__x);
          if (sVar5 == 0) {
            local_61 = 1;
            break;
          }
        }
        __gnu_cxx::
        __normal_iterator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_*,_std::vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>_>
        ::operator++(&local_98);
      }
      if ((local_61 & 1) != 0) break;
      std::_Rb_tree_iterator<std::pair<const_int,_mir::inst::BasicBlk>_>::operator++
                ((_Rb_tree_iterator<std::pair<const_int,_mir::inst::BasicBlk>_> *)
                 in_stack_ffffffffffffff30);
    }
    if ((local_61 & 1) != 0) {
      std::
      set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::erase(in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
    }
    std::
    _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mir::inst::MirFunction>_>
    ::operator++((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mir::inst::MirFunction>_>
                  *)in_stack_ffffffffffffff30);
  } while( true );
}

Assistant:

void init_funcs(mir::inst::MirPackage& package) {
    for (auto& funcpair : package.functions) {
      if (funcpair.second.type->is_extern) continue;
      mergeable_funcs.insert(funcpair.first);
    }
    for (auto& funcpair : package.functions) {
      bool flag = false;
      for (auto& blkpair : funcpair.second.basic_blks) {
        for (auto& inst : blkpair.second.inst) {
          if (inst->inst_kind() == mir::inst::InstKind::Load ||
              inst->inst_kind() == mir::inst::InstKind::Store) {
            flag = true;
            break;
          }
          if (inst->inst_kind() == mir::inst::InstKind::Call) {
            auto& i = *inst;
            auto callInst = dynamic_cast<mir::inst::CallInst*>(&i);
            if (!mergeable_funcs.count(callInst->func)) {
              flag = true;
              break;
            }
          }
        }
        if (flag) {
          break;
        }
      }
      if (flag) {
        mergeable_funcs.erase(funcpair.first);
      }
    }
  }